

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Vec_Int_t * Saig_RefManReason2Inputs(Saig_RefMan_t *p,Vec_Int_t *vReasons)

{
  int iVar1;
  uint i;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int i_00;
  
  p_00 = Vec_IntAlloc(p->pAig->nTruePis);
  p_01 = Vec_IntStart(p->pAig->nTruePis);
  i_00 = 0;
  while( true ) {
    if (vReasons->nSize <= i_00) {
      Vec_IntFree(p_01);
      return p_00;
    }
    iVar1 = Vec_IntEntry(vReasons,i_00);
    i = Vec_IntEntry(p->vMapPiF2A,iVar1 * 2);
    if (((int)i < 0) || (p->pAig->nObjs[2] <= (int)i)) break;
    iVar1 = Vec_IntEntry(p_01,i);
    if (iVar1 == 0) {
      Vec_IntPush(p_00,i);
    }
    if (p_01->nSize <= (int)i) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
    p_01->pArray[i] = p_01->pArray[i] + 1;
    i_00 = i_00 + 1;
  }
  __assert_fail("iInput >= 0 && iInput < Aig_ManCiNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                ,0x49,"Vec_Int_t *Saig_RefManReason2Inputs(Saig_RefMan_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Saig_RefManReason2Inputs( Saig_RefMan_t * p, Vec_Int_t * vReasons )
{
    Vec_Int_t * vOriginal, * vVisited;
    int i, Entry;
    vOriginal = Vec_IntAlloc( Saig_ManPiNum(p->pAig) ); 
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        assert( iInput >= 0 && iInput < Aig_ManCiNum(p->pAig) );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            Vec_IntPush( vOriginal, iInput );
        Vec_IntAddToEntry( vVisited, iInput, 1 );
    }
    Vec_IntFree( vVisited );
    return vOriginal;
}